

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::kotlin::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Context *context)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this_00;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_01;
  OneofDescriptor *pOVar1;
  bool bVar2;
  bool bVar3;
  ClassNameResolver *pCVar4;
  FieldDescriptor *pFVar5;
  reference ppVar6;
  int index;
  Descriptor *this_02;
  OneofDescriptor *oneof;
  int local_7c;
  OneofDescriptor *local_78;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_70;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *local_68;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> local_60;
  LogMessageFatal local_40 [16];
  
  this->_vptr_MessageGenerator = (_func_int **)&PTR__MessageGenerator_00521be0;
  this->context_ = context;
  pCVar4 = java::Context::GetNameResolver(context);
  this->name_resolver_ = pCVar4;
  this->descriptor_ = descriptor;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
                 ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
  .value = (btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
            *)absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
              ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  bVar3 = (context->options_).enforce_lite;
  this->lite_ = bVar3;
  bVar2 = true;
  if (bVar3 == true) {
    bVar2 = (context->options_).jvm_dsl;
  }
  this->jvm_dsl_ = bVar2;
  this_00 = &this->lite_field_generators_;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(this_00,descriptor);
  this_01 = &this->field_generators_;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
  FieldGeneratorMap(this_01,this->descriptor_);
  this_02 = this->descriptor_;
  local_70 = this_01;
  local_68 = this_00;
  if (0 < *(int *)(this_02 + 4)) {
    index = 0;
    do {
      pFVar5 = Descriptor::field(this_02,index);
      bVar3 = java::IsRealOneof(pFVar5);
      if (bVar3) {
        pFVar5 = Descriptor::field(this->descriptor_,index);
        pOVar1 = *(OneofDescriptor **)(pFVar5 + 0x28);
        if (pOVar1 == (OneofDescriptor *)0x0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xa9a);
        }
        local_7c = (int)((ulong)((long)pOVar1 - *(long *)(*(long *)(pOVar1 + 0x10) + 0x40)) >> 3) *
                   -0x49249249;
        local_78 = pOVar1;
        absl::lts_20240722::container_internal::
        btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
        ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                  ((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
                    *)&local_60,&this->oneofs_,&local_7c,&local_78);
        ppVar6 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)&local_60);
        if (ppVar6->second != local_78) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/kotlin/message.cc"
                     ,0x32,0x3d,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        }
      }
      index = index + 1;
      this_02 = this->descriptor_;
    } while (index < *(int *)(this_02 + 4));
  }
  if (this->lite_ == false) {
    java::MakeImmutableFieldGenerators(&local_60,this_02,this->context_);
    (this->field_generators_).descriptor_ = local_60.descriptor_;
    std::
    vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
    ::_M_move_assign(&(this->field_generators_).field_generators_);
    java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
    ~FieldGeneratorMap(&local_60);
  }
  else {
    java::MakeImmutableFieldLiteGenerators
              ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)
               &local_60,this_02,this->context_);
    (this->lite_field_generators_).descriptor_ = local_60.descriptor_;
    std::
    vector<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
    ::_M_move_assign(&(this->lite_field_generators_).field_generators_);
    java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
    ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                        *)&local_60);
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   java::Context* context)
    : context_(context),
      name_resolver_(context->GetNameResolver()),
      descriptor_(descriptor),
      lite_(!java::HasDescriptorMethods(descriptor_->file(),
                                        context->EnforceLite())),
      jvm_dsl_(!lite_ || context->options().jvm_dsl),
      lite_field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldLiteGenerator>(
              descriptor_)),
      field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldGenerator>(descriptor_)) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (java::IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
  if (lite_) {
    lite_field_generators_ =
        java::MakeImmutableFieldLiteGenerators(descriptor_, context_);
  } else {
    field_generators_ =
        java::MakeImmutableFieldGenerators(descriptor_, context_);
  }
}